

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void __thiscall OjaNewton::update_b(OjaNewton *this)

{
  int j;
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  
  for (uVar1 = 1; (long)uVar1 <= (long)this->m; uVar1 = uVar1 + 1) {
    fVar3 = 0.0;
    for (uVar2 = uVar1; this->m + 1 != uVar2; uVar2 = uVar2 + 1) {
      fVar3 = fVar3 + ((this->data).AZx[uVar2] * this->ev[uVar2] * this->A[uVar2][uVar1]) /
                      ((this->ev[uVar2] + this->alpha) * this->alpha);
    }
    this->b[uVar1] = fVar3 * (this->data).g + this->b[uVar1];
  }
  return;
}

Assistant:

void update_b()
  {
    for (int j = 1; j <= m; j++)
    {
      float tmp = 0;
      for (int i = j; i <= m; i++)
      {
        tmp += ev[i] * data.AZx[i] * A[i][j] / (alpha * (alpha + ev[i]));
      }
      b[j] += tmp * data.g;
    }
  }